

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_insert(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  
  pTVar1 = stkindex2adr(L,idx);
  for (pTVar2 = L->top; pTVar1 < pTVar2; pTVar2 = pTVar2 + -1) {
    *pTVar2 = pTVar2[-1];
  }
  *pTVar1 = *L->top;
  return;
}

Assistant:

LUA_API void lua_insert(lua_State *L, int idx)
{
  TValue *q, *p = stkindex2adr(L, idx);
  api_checkvalidindex(L, p);
  for (q = L->top; q > p; q--) copyTV(L, q, q-1);
  copyTV(L, p, L->top);
}